

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenuPrivate::updateActionRects(QMenuPrivate *this,QRect *screen)

{
  QList<QRect> *this_00;
  short sVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  Data *pDVar5;
  Data *pDVar6;
  qsizetype qVar7;
  QChar *pQVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  undefined1 uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  QStyle *pQVar21;
  Node<QAction_*,_QWidget_*> *pNVar22;
  long lVar23;
  QStyle *pQVar24;
  QWidget **ppQVar25;
  QSize QVar26;
  QSize QVar27;
  undefined8 uVar28;
  QSize QVar29;
  QArrayData *pQVar30;
  pointer pQVar31;
  int iVar32;
  uint uVar33;
  ushort uVar34;
  int extraout_EDX;
  Representation RVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  QWidget *this_01;
  QWidget *pQVar41;
  long lVar42;
  byte bVar43;
  Representation RVar44;
  long in_FS_OFFSET;
  bool bVar45;
  QKeySequence seq;
  QIcon is_1;
  QIcon is;
  QAction *action_1;
  QFontMetrics qfm;
  QAction *action;
  QStyleOption opt;
  int local_21c;
  ulong local_218;
  int local_204;
  undefined1 *local_1b0;
  QString local_1a8;
  QArrayData *local_188;
  QChar *pQStack_180;
  QArrayData *local_178;
  QArrayData *local_168;
  long local_158;
  undefined8 local_150;
  QIcon local_148;
  QIcon local_140 [2];
  long local_130;
  QAction *local_128;
  undefined1 *local_120;
  undefined1 local_118 [96];
  QArrayData *local_b8;
  QIcon local_a0 [2];
  QFont local_90 [24];
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x420 & 1) != 0) {
    pQVar41 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    QWidget::ensurePolished(pQVar41);
    this_00 = &this->actionRects;
    QList<QRect>::resize(this_00,(this->super_QWidgetPrivate).actions.d.size);
    local_118._0_8_ = (QAction *)0x0;
    local_118._8_4_ = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0xffffffff;
    local_118._12_4_ = ~LeftToRight;
    QList<QRect>::fill(this_00,(parameter_type)local_118,-1);
    uVar13 = getLastVisibleAction(this);
    pQVar21 = QWidget::style(pQVar41);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
    QStyleOption::initFrom((QStyleOption *)local_78,pQVar41);
    iVar14 = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x1c,(QStyleOption *)local_78,pQVar41);
    iVar15 = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x1d,(QStyleOption *)local_78,pQVar41);
    iVar16 = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x3e,(QStyleOption *)local_78,pQVar41);
    iVar17 = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x1e,(QStyleOption *)local_78,pQVar41);
    iVar18 = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x20,(QStyleOption *)local_78,pQVar41);
    local_21c = 0;
    if ((this->field_0x421 & 2) != 0) {
      local_21c = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x1f,local_78,pQVar41);
    }
    sVar1 = (this->super_QWidgetPrivate).topmargin;
    iVar32 = 0;
    if (this->scroll != (QMenuScroller *)0x0) {
      iVar32 = this->scroll->scrollOffset;
    }
    iVar20 = (screen->y2).m_i;
    sVar2 = (this->super_QWidgetPrivate).bottommargin;
    iVar36 = (screen->y1).m_i;
    this->maxIconWidth = 0;
    this->tabWidth = 0;
    this->field_0x420 = this->field_0x420 & 0xfd;
    this->ncols = '\x01';
    if ((this->super_QWidgetPrivate).actions.d.size != 0) {
      uVar40 = 0;
      do {
        local_118._0_8_ = (this->super_QWidgetPrivate).actions.d.ptr[uVar40];
        cVar9 = QAction::isSeparator();
        if (((cVar9 == '\0') && (cVar9 = QAction::isVisible(), cVar9 != '\0')) &&
           ((pDVar5 = (this->widgetItems).d, pDVar5 == (Data *)0x0 ||
            (pNVar22 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::findNode<QAction*>
                                 ((Data<QHashPrivate::Node<QAction*,QWidget*>> *)pDVar5,
                                  (QAction **)local_118),
            pNVar22 == (Node<QAction_*,_QWidget_*> *)0x0)))) {
          cVar9 = QAction::isCheckable();
          uVar34 = *(ushort *)&this->field_0x420 & 2;
          if (cVar9 != '\0') {
            uVar34 = 2;
          }
          *(ushort *)&this->field_0x420 = *(ushort *)&this->field_0x420 & 0xfffd | uVar34;
          local_140[0].d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QAction::icon();
          cVar9 = QIcon::isNull();
          if (cVar9 == '\0') {
            uVar33 = this->maxIconWidth;
            if (this->maxIconWidth <= iVar16 + 4U) {
              uVar33 = iVar16 + 4U;
            }
            this->maxIconWidth = uVar33;
          }
          QIcon::~QIcon(local_140);
        }
        uVar40 = uVar40 + 1;
      } while (uVar40 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
    iVar32 = local_21c + iVar15 + iVar17 + sVar1 + iVar32;
    iVar15 = ((iVar20 - (iVar15 + iVar17 + iVar18 * 2)) - (sVar2 + iVar36)) + 1;
    local_120 = &DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_120,&pQVar41->data->fnt);
    topCausedWidget(this);
    lVar23 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    pQVar24 = QWidget::style(pQVar41);
    local_218._0_4_ = 0;
    iVar18 = (**(code **)(*(long *)pQVar24 + 0xf0))(pQVar24,0x61,0,pQVar41);
    if (-1 < (int)uVar13) {
      lVar42 = 0;
      bVar43 = 1;
      local_218 = 0;
      local_204 = iVar32;
      do {
        local_128 = *(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar42);
        cVar9 = QAction::isSeparator();
        if (cVar9 == '\0') {
          bVar45 = false;
          bVar10 = 1;
        }
        else {
          QAction::text();
          if (local_130 == 0) {
            QAction::icon();
            bVar10 = QIcon::isNull();
            bVar45 = true;
          }
          else {
            bVar45 = false;
            bVar10 = 0;
          }
        }
        if (bVar45) {
          QIcon::~QIcon(&local_148);
        }
        if ((cVar9 != '\0') && ((QArrayData *)local_140[0].d != (QArrayData *)0x0)) {
          LOCK();
          *(int *)local_140[0].d = *(int *)local_140[0].d + -1;
          UNLOCK();
          if (*(int *)local_140[0].d == 0) {
            QArrayData::deallocate((QArrayData *)local_140[0].d,2,0x10);
          }
        }
        bVar11 = 1;
        if ((iVar18 == 0 & (bVar10 ^ 1)) == 0) {
          bVar11 = QAction::isSeparator();
          bVar11 = bVar10 & bVar11;
        }
        cVar9 = QAction::isVisible();
        if ((cVar9 != '\0') &&
           ((((this->field_0x420 & 8) == 0 || (bVar11 == 0)) || ((bVar43 & 1) == 0)))) {
          memset((QStyleOptionMenuItem *)local_118,0xaa,0x98);
          QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)local_118);
          (**(code **)(*(long *)pQVar41 + 0x1a0))
                    (pQVar41,(QStyleOptionMenuItem *)local_118,local_128);
          local_150 = 0xffffffffffffffff;
          pDVar5 = (this->widgetItems).d;
          if ((pDVar5 == (Data *)0x0) ||
             (pNVar22 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::
                        findNode<QAction*>((Data<QHashPrivate::Node<QAction*,QWidget*>> *)pDVar5,
                                           &local_128), pNVar22 == (Node<QAction_*,_QWidget_*> *)0x0
             )) {
            ppQVar25 = (QWidget **)0x0;
          }
          else {
            ppQVar25 = &pNVar22->value;
          }
          if (ppQVar25 == (QWidget **)0x0) {
            this_01 = (QWidget *)0x0;
          }
          else {
            this_01 = *ppQVar25;
          }
          if (this_01 == (QWidget *)0x0) {
            cVar9 = QAction::isSeparator();
            if (cVar9 == '\0') {
              bVar45 = false;
            }
            else {
              QAction::text();
              bVar45 = local_158 == 0;
            }
            if ((cVar9 != '\0') && (local_168 != (QArrayData *)0x0)) {
              LOCK();
              (local_168->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_168->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_168->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_168,2,0x10);
              }
            }
            if (bVar45) {
              local_150._0_4_ = 2;
              local_150._4_4_ = 2;
            }
            else {
              local_178 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
              local_188 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
              pQStack_180 = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
              QAction::text();
              local_1a8.d.d = (Data *)local_178;
              local_1a8.d.ptr = &pQStack_180->ucs;
              pQVar30 = (QArrayData *)
                        QStringView::indexOf((QStringView *)&local_1a8,(QChar)0x9,0,CaseSensitive);
              if (pQVar30 == (QArrayData *)0xffffffffffffffff) {
                cVar9 = QAction::isShortcutVisibleInContextMenu();
                if ((lVar23 != 0) || (cVar9 != '\0')) {
                  local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
                  QAction::shortcut();
                  cVar9 = QKeySequence::isEmpty();
                  if (cVar9 == '\0') {
                    uVar3 = this->tabWidth;
                    QKeySequence::toString((SequenceFormat)&local_1a8);
                    uVar19 = QFontMetrics::horizontalAdvance
                                       ((QString *)&local_120,(SequenceFormat)&local_1a8);
                    if ((int)uVar19 < (int)uVar3) {
                      uVar19 = uVar3;
                    }
                    this->tabWidth = uVar19;
                    if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1a8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  QKeySequence::~QKeySequence((QKeySequence *)&local_1b0);
                }
              }
              else {
                uVar3 = this->tabWidth;
                QString::mid((longlong)&local_1a8,(longlong)&local_188);
                uVar19 = QFontMetrics::horizontalAdvance
                                   ((QString *)&local_120,(int)(QStringView *)&local_1a8);
                if ((int)uVar19 < (int)uVar3) {
                  uVar19 = uVar3;
                }
                this->tabWidth = uVar19;
                if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (pQVar30 < local_178) {
                  QString::QString(&local_1a8,pQStack_180,(longlong)pQVar30);
                }
                else {
                  local_1a8.d.d = (Data *)local_188;
                  local_1a8.d.ptr = &pQStack_180->ucs;
                  local_1a8.d.size = (qsizetype)local_178;
                  if (local_188 != (QArrayData *)0x0) {
                    LOCK();
                    (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_188->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                }
                pQVar8 = pQStack_180;
                pQVar30 = local_188;
                qVar7 = local_1a8.d.size;
                pDVar6 = local_1a8.d.d;
                local_1a8.d.d = (Data *)local_188;
                local_188 = &pDVar6->super_QArrayData;
                pQStack_180 = (QChar *)local_1a8.d.ptr;
                local_1a8.d.ptr = &pQVar8->ucs;
                local_1a8.d.size = (qsizetype)local_178;
                local_178 = (QArrayData *)qVar7;
                if (pQVar30 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(pQVar30,2,0x10);
                  }
                }
              }
              local_1a8.d.d = (Data *)0x0;
              local_1a8.d.ptr = (storage_type_conflict *)0xffffffffffffffff;
              iVar20 = QFontMetrics::boundingRect
                                 ((QRect *)(local_118 + 0x20),(int)&local_1a8,(QString *)0x900,
                                  (int)&local_188,(int *)0x0);
              local_150 = CONCAT44(local_150._4_4_,(extraout_EDX - iVar20) + 1);
              iVar36 = QFontMetrics::height();
              iVar20 = QFontMetrics::height();
              if (iVar20 < iVar36) {
                iVar20 = iVar36;
              }
              local_1a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_150._4_4_ = iVar20;
              QAction::icon();
              cVar9 = QIcon::isNull();
              if ((cVar9 == '\0') && (local_150._4_4_ < iVar16)) {
                local_150._4_4_ = iVar16;
              }
              QIcon::~QIcon((QIcon *)&local_1a8);
              if (local_188 != (QArrayData *)0x0) {
                LOCK();
                (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_188->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_188->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_188,2,0x10);
                }
              }
            }
            uVar40 = (**(code **)(*(long *)pQVar21 + 0xe8))(pQVar21,7,local_118,&local_150);
          }
          else {
            QVar26 = (QSize)(**(code **)(*(long *)this_01 + 0x70))(this_01);
            QVar27 = QWidget::minimumSize(this_01);
            QVar29 = QVar27;
            if (QVar27.wd.m_i.m_i < QVar26.wd.m_i.m_i) {
              QVar29 = QVar26;
            }
            RVar35.m_i = QVar27.ht.m_i.m_i;
            if (QVar27.ht.m_i.m_i < QVar26.ht.m_i.m_i) {
              RVar35.m_i = QVar26.ht.m_i.m_i;
            }
            uVar28 = (**(code **)(*(long *)this_01 + 0x78))(this_01);
            RVar44.m_i = QVar29.wd.m_i.m_i;
            if (QVar29.wd.m_i.m_i <= (int)(uint)uVar28) {
              RVar44.m_i = (uint)uVar28;
            }
            uVar33 = (uint)((ulong)uVar28 >> 0x20);
            if (RVar35.m_i <= (int)uVar33) {
              RVar35.m_i = uVar33;
            }
            QVar29 = QWidget::maximumSize(this_01);
            uVar40 = (ulong)(uint)RVar44.m_i;
            if (QVar29.wd.m_i.m_i <= RVar44.m_i) {
              uVar40 = (ulong)QVar29 & 0xffffffff;
            }
            uVar37 = (ulong)(uint)RVar35.m_i;
            if (QVar29.ht.m_i.m_i <= RVar35.m_i) {
              uVar37 = (ulong)QVar29 >> 0x20;
            }
            uVar40 = uVar40 | uVar37 << 0x20;
          }
          iVar20 = (int)uVar40;
          local_150._4_4_ = (int)(uVar40 >> 0x20);
          if (0 < local_150._4_4_ && 0 < iVar20) {
            if ((int)local_218 <= iVar20) {
              local_218 = uVar40;
            }
            local_218 = local_218 & 0xffffffff;
            local_204 = local_204 + local_150._4_4_;
            if ((this->scroll == (QMenuScroller *)0x0) && (iVar15 < local_204)) {
              this->ncols = this->ncols + '\x01';
              local_204 = iVar32;
            }
            iVar36 = local_150._4_4_ + -1;
            local_150 = uVar40;
            pQVar31 = QList<QRect>::data(this_00);
            *(undefined8 *)((long)&(pQVar31->x1).m_i + lVar42 * 2) = 0;
            *(int *)((long)&(pQVar31->x2).m_i + lVar42 * 2) = iVar20 + -1;
            *(int *)((long)&(pQVar31->y2).m_i + lVar42 * 2) = iVar36;
            uVar40 = local_150;
          }
          local_150 = uVar40;
          QFont::~QFont(local_90);
          QIcon::~QIcon(local_a0);
          if (local_b8 != (QArrayData *)0x0) {
            LOCK();
            (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_b8,2,0x10);
            }
          }
          QStyleOption::~QStyleOption((QStyleOption *)local_118);
          bVar43 = bVar11;
        }
        lVar42 = lVar42 + 8;
      } while ((ulong)uVar13 * 8 + 8 != lVar42);
    }
    local_218._0_4_ = (int)local_218 + this->tabWidth;
    if (((this->field_0x421 & 4) == 0) ||
       (iVar16 = (int)local_218, this->scroll != (QMenuScroller *)0x0)) {
      local_118._0_8_ = (QAction *)0x0;
      iVar16 = (**(code **)(*(long *)pQVar21 + 0xe8))(pQVar21,10,local_78,local_118,pQVar41);
      QVar29 = QWidget::minimumSize(pQVar41);
      iVar16 = QVar29.wd.m_i.m_i -
               ((this->super_QWidgetPrivate).leftmargin + iVar16 + (iVar14 + iVar17) * 2 +
               (int)(this->super_QWidgetPrivate).rightmargin);
      if (iVar16 <= (int)local_218) {
        iVar16 = (int)local_218;
      }
    }
    if ((this->super_QWidgetPrivate).actions.d.size != 0) {
      iVar18 = iVar17 + iVar14 + (int)(this->super_QWidgetPrivate).leftmargin;
      lVar42 = 0;
      lVar23 = 0;
      uVar40 = 0;
      iVar17 = iVar32;
      do {
        pQVar31 = QList<QRect>::data(this_00);
        iVar20 = *(int *)((long)&(pQVar31->x1).m_i + lVar23 * 2);
        iVar36 = *(int *)((long)&(pQVar31->y1).m_i + lVar23 * 2);
        iVar4 = *(int *)((long)&(pQVar31->y2).m_i + lVar23 * 2);
        if ((*(int *)((long)&(pQVar31->x2).m_i + lVar23 * 2) != iVar20 + -1) ||
           (iVar4 != iVar36 + -1)) {
          if (this->scroll == (QMenuScroller *)0x0) {
            iVar38 = (iVar17 - iVar36) + iVar4 + 1;
            if (iVar15 < iVar38) {
              iVar17 = iVar32;
            }
            iVar39 = 0;
            if (iVar15 < iVar38) {
              iVar39 = iVar14 + iVar16;
            }
            iVar18 = iVar18 + iVar39;
          }
          iVar20 = iVar20 + iVar18;
          *(int *)((long)&(pQVar31->x1).m_i + lVar23 * 2) = iVar20;
          *(int *)((long)&(pQVar31->y1).m_i + lVar23 * 2) = iVar36 + iVar17;
          *(int *)((long)&(pQVar31->y2).m_i + lVar23 * 2) = iVar4 + iVar17;
          *(int *)((long)&(pQVar31->x2).m_i + lVar23 * 2) = iVar20 + iVar16 + -1;
          pDVar5 = (this->widgetItems).d;
          if ((pDVar5 == (Data *)0x0) ||
             (pNVar22 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::
                        findNode<QAction*>((Data<QHashPrivate::Node<QAction*,QWidget*>> *)pDVar5,
                                           (QAction **)
                                           ((long)(this->super_QWidgetPrivate).actions.d.ptr +
                                           lVar23)), pNVar22 == (Node<QAction_*,_QWidget_*> *)0x0))
          {
            ppQVar25 = (QWidget **)0x0;
          }
          else {
            ppQVar25 = &pNVar22->value;
          }
          if (ppQVar25 == (QWidget **)0x0) {
            pQVar41 = (QWidget *)0x0;
          }
          else {
            pQVar41 = *ppQVar25;
          }
          if (pQVar41 != (QWidget *)0x0) {
            QWidget::setGeometry(pQVar41,(QRect *)((long)&(pQVar31->x1).m_i + lVar42));
            uVar12 = QAction::isVisible();
            (**(code **)(*(long *)pQVar41 + 0x68))(pQVar41,uVar12);
          }
          iVar17 = ((iVar17 + *(int *)((long)&(pQVar31->y2).m_i + lVar23 * 2)) -
                   *(int *)((long)&(pQVar31->y1).m_i + lVar23 * 2)) + 1;
        }
        uVar40 = uVar40 + 1;
        lVar23 = lVar23 + 8;
        lVar42 = lVar42 + 0x10;
      } while (uVar40 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
    this->field_0x420 = this->field_0x420 & 0xfe;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_120);
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::updateActionRects(const QRect &screen) const
{
    Q_Q(const QMenu);
    if (!itemsDirty)
        return;

    q->ensurePolished();

    //let's reinitialize the buffer
    actionRects.resize(actions.size());
    actionRects.fill(QRect());

    int lastVisibleAction = getLastVisibleAction();

    QStyle *style = q->style();
    QStyleOption opt;
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q),
              vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q),
              icone = style->pixelMetric(QStyle::PM_SmallIconSize, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);
    const int deskFw = style->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, &opt, q);
    const int tearoffHeight = tearoff ? style->pixelMetric(QStyle::PM_MenuTearoffHeight, &opt, q) : 0;
    const int base_y = vmargin + fw + topmargin + (scroll ? scroll->scrollOffset : 0) + tearoffHeight;
    const int column_max_y = screen.height() - 2 * deskFw - (vmargin + bottommargin + fw);
    int max_column_width = 0;
    int y = base_y;

    //for compatibility now - will have to refactor this away
    tabWidth = 0;
    maxIconWidth = 0;
    hasCheckableItems = false;
    ncols = 1;

    for (int i = 0; i < actions.size(); ++i) {
        QAction *action = actions.at(i);
        if (action->isSeparator() || !action->isVisible() || widgetItems.contains(action))
            continue;
        //..and some members
        hasCheckableItems |= action->isCheckable();
        QIcon is = action->icon();
        if (!is.isNull()) {
            maxIconWidth = qMax<uint>(maxIconWidth, icone + 4);
        }
    }

    //calculate size
    QFontMetrics qfm = q->fontMetrics();
    bool previousWasSeparator = true; // this is true to allow removing the leading separators
#if QT_CONFIG(shortcut)
    const bool contextMenu = isContextMenu();
#endif
    const bool menuSupportsSections = q->style()->styleHint(QStyle::SH_Menu_SupportsSections, nullptr, q);
    for(int i = 0; i <= lastVisibleAction; i++) {
        QAction *action = actions.at(i);
        const bool isSection = action->isSeparator() && (!action->text().isEmpty() || !action->icon().isNull());
        const bool isPlainSeparator = (isSection && !menuSupportsSections)
                                   || (action->isSeparator() && !isSection);

        if (!action->isVisible() ||
            (collapsibleSeparators && previousWasSeparator && isPlainSeparator))
            continue; // we continue, this action will get an empty QRect

        previousWasSeparator = isPlainSeparator;

        //let the style modify the above size..
        QStyleOptionMenuItem opt;
        q->initStyleOption(&opt, action);
        const QFontMetrics &fm = opt.fontMetrics;

        QSize sz;
        if (QWidget *w = widgetItems.value(action)) {
          sz = w->sizeHint().expandedTo(w->minimumSize()).expandedTo(w->minimumSizeHint()).boundedTo(w->maximumSize());
        } else {
            //calc what I think the size is..
            if (action->isSeparator() && action->text().isEmpty()) {
                sz = QSize(2, 2);
            } else {
                QString s = action->text();
                qsizetype t = s.indexOf(u'\t');
                if (t != -1) {
                    tabWidth = qMax(int(tabWidth), qfm.horizontalAdvance(s.mid(t+1)));
                    s = s.left(t);
#if QT_CONFIG(shortcut)
                } else if (action->isShortcutVisibleInContextMenu() || !contextMenu) {
                    QKeySequence seq = action->shortcut();
                    if (!seq.isEmpty())
                        tabWidth = qMax(int(tabWidth), qfm.horizontalAdvance(seq.toString(QKeySequence::NativeText)));
#endif
                }
                sz.setWidth(fm.boundingRect(QRect(), Qt::TextSingleLine | Qt::TextShowMnemonic, s).width());
                sz.setHeight(qMax(fm.height(), qfm.height()));

                QIcon is = action->icon();
                if (!is.isNull()) {
                    QSize is_sz = QSize(icone, icone);
                    if (is_sz.height() > sz.height())
                        sz.setHeight(is_sz.height());
                }
            }
            sz = style->sizeFromContents(QStyle::CT_MenuItem, &opt, sz, q);
        }


        if (!sz.isEmpty()) {
            max_column_width = qMax(max_column_width, sz.width());
            //wrapping
            if (!scroll && y + sz.height() > column_max_y) {
                ncols++;
                y = base_y;
            } else {
                y += sz.height();
            }
            //update the item
            actionRects[i] = QRect(0, 0, sz.width(), sz.height());
        }
    }

    max_column_width += tabWidth; //finally add in the tab width
    if (!tornoff || scroll) { // exclude non-scrollable tear-off menu since the tear-off menu has a fixed size
        const int sfcMargin = style->sizeFromContents(QStyle::CT_Menu, &opt, QSize(0, 0), q).width();
        const int min_column_width = q->minimumWidth() - (sfcMargin + leftmargin + rightmargin + 2 * (fw + hmargin));
        max_column_width = qMax(min_column_width, max_column_width);
    }

    //calculate position
    int x = hmargin + fw + leftmargin;
    y = base_y;

    for(int i = 0; i < actions.size(); i++) {
        QRect &rect = actionRects[i];
        if (rect.isNull())
            continue;
        if (!scroll && y + rect.height() > column_max_y) {
            x += max_column_width + hmargin;
            y = base_y;
        }
        rect.translate(x, y);                        //move
        rect.setWidth(max_column_width); //uniform width

        //we need to update the widgets geometry
        if (QWidget *widget = widgetItems.value(actions.at(i))) {
            widget->setGeometry(rect);
            widget->setVisible(actions.at(i)->isVisible());
        }

        y += rect.height();
    }
    itemsDirty = 0;
}